

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchStateController::SetOwner(CSynchStateController *this,CPalThread *pNewOwningThread)

{
  FILE *__stream;
  OwnershipSemantics OVar1;
  LONG LVar2;
  uint uVar3;
  uint uVar4;
  CPalThread *pCVar5;
  PAL_ERROR local_1c;
  PAL_ERROR palErr;
  CPalThread *pNewOwningThread_local;
  CSynchStateController *this_local;
  
  pCVar5 = InternalGetCurrentThread();
  if (pCVar5 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x27a);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (pNewOwningThread == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x27b);
    fprintf(_stderr,"Expression: NULL != pNewOwningThread\n");
  }
  OVar1 = CObjectType::GetOwnershipSemantics((this->super_CSynchControllerBase).m_potObjectType);
  if (OVar1 != OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x27f);
    fprintf(_stderr,
            "Expression: CObjectType::OwnershipTracked == m_potObjectType->GetOwnershipSemantics(), Description: SetOwner called on an object without OwnershipTracked semantics\n"
           );
  }
  LVar2 = CSynchData::GetOwnershipCount((this->super_CSynchControllerBase).m_psdSynchData);
  if (LVar2 == 0) {
    local_1c = CSynchData::AssignOwnershipToThread
                         ((this->super_CSynchControllerBase).m_psdSynchData,
                          (this->super_CSynchControllerBase).m_pthrOwner,pNewOwningThread);
    LVar2 = CSynchData::GetOwnershipCount((this->super_CSynchControllerBase).m_psdSynchData);
    if ((LVar2 != 0) &&
       (LVar2 = CSynchData::GetSignalCount((this->super_CSynchControllerBase).m_psdSynchData),
       LVar2 != 0)) {
      fprintf(_stderr,"] %s %s:%d","SetOwner",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x290);
      __stream = _stderr;
      uVar3 = CSynchData::GetOwnershipCount((this->super_CSynchControllerBase).m_psdSynchData);
      uVar4 = CSynchData::GetSignalCount((this->super_CSynchControllerBase).m_psdSynchData);
      fprintf(__stream,
              "Expression: 0 == m_psdSynchData->GetOwnershipCount() || 0 == m_psdSynchData->GetSignalCount(), Description: Conflicting values for SignalCount [%d] and OwnershipCount [%d]\n"
              ,(ulong)uVar3,(ulong)uVar4);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","SetOwner",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x283);
    fprintf(_stderr,"Ownership count should be zero at this time\n");
    local_1c = 0x54f;
  }
  return local_1c;
}

Assistant:

PAL_ERROR CSynchStateController::SetOwner(CPalThread * pNewOwningThread)
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(NULL != pNewOwningThread);
        _ASSERT_MSG(CObjectType::OwnershipTracked == 
                    m_potObjectType->GetOwnershipSemantics(),
                    "SetOwner called on an object without OwnershipTracked "
                    "semantics\n");
        
        if (0 != m_psdSynchData->GetOwnershipCount())
        {
            ASSERT("Ownership count should be zero at this time\n");
            palErr = ERROR_INTERNAL_ERROR;
            goto SO_exit;
        }

        palErr = m_psdSynchData->AssignOwnershipToThread(m_pthrOwner, 
                                                       pNewOwningThread);

        _ASSERT_MSG(0 == m_psdSynchData->GetOwnershipCount() || 
                    0 == m_psdSynchData->GetSignalCount(),
                    "Conflicting values for SignalCount [%d] and "
                    "OwnershipCount [%d]\n", 
                    m_psdSynchData->GetOwnershipCount(), 
                    m_psdSynchData->GetSignalCount());
        
    SO_exit:
        return palErr;
    }